

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void Cmd_testblend(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  FString *this;
  char *pcVar3;
  double dVar4;
  FString local_48 [3];
  float local_30;
  uint local_2c;
  float amt;
  int color;
  FString colorstring;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  colorstring.Chars._4_4_ = key;
  FString::FString((FString *)&amt);
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 3) {
    Printf("testblend <color> <amount>\n");
  }
  else {
    FCommandLine::operator[](argv,1);
    V_GetColorStringByName((char *)local_48);
    this = FString::operator=((FString *)&amt,local_48);
    bVar1 = FString::IsEmpty(this);
    FString::~FString(local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pcVar3 = FCommandLine::operator[](argv,1);
      local_2c = V_GetColorFromString((DWORD *)0x0,pcVar3);
    }
    else {
      pcVar3 = FString::operator_cast_to_char_((FString *)&amt);
      local_2c = V_GetColorFromString((DWORD *)0x0,pcVar3);
    }
    pcVar3 = FCommandLine::operator[](argv,2);
    dVar4 = atof(pcVar3);
    local_30 = (float)dVar4;
    if (local_30 <= 1.0) {
      if (local_30 < 0.0) {
        local_30 = 0.0;
      }
    }
    else {
      local_30 = 1.0;
    }
    BaseBlendR = (int)local_2c >> 0x10 & 0xff;
    BaseBlendG = (int)local_2c >> 8 & 0xff;
    BaseBlendB = local_2c & 0xff;
    BaseBlendA = local_30;
  }
  FString::~FString((FString *)&amt);
  return;
}

Assistant:

CCMD (testblend)
{
	FString colorstring;
	int color;
	float amt;

	if (argv.argc() < 3)
	{
		Printf ("testblend <color> <amount>\n");
	}
	else
	{
		if ( !(colorstring = V_GetColorStringByName (argv[1])).IsEmpty() )
		{
			color = V_GetColorFromString (NULL, colorstring);
		}
		else
		{
			color = V_GetColorFromString (NULL, argv[1]);
		}
		amt = (float)atof (argv[2]);
		if (amt > 1.0f)
			amt = 1.0f;
		else if (amt < 0.0f)
			amt = 0.0f;
		BaseBlendR = RPART(color);
		BaseBlendG = GPART(color);
		BaseBlendB = BPART(color);
		BaseBlendA = amt;
	}
}